

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall Function_Pool::FunctionTask::FunctionTask(FunctionTask *this)

{
  FunctionPoolTask *in_RDI;
  
  FunctionPoolTask::FunctionPoolTask(in_RDI);
  (in_RDI->super_TaskProviderSingleton).super_AbstractTaskProvider._vptr_AbstractTaskProvider =
       (_func_int **)&PTR__FunctionTask_0016fd68;
  *(undefined4 *)
   &in_RDI[1].super_TaskProviderSingleton.super_AbstractTaskProvider._vptr_AbstractTaskProvider = 0;
  InputInfo::InputInfo((InputInfo *)0x1453fd);
  OutputInfo::OutputInfo((OutputInfo *)in_RDI);
  return;
}

Assistant:

FunctionTask()
            : functionId( _none )
        {}